

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

bool pbrt::HasExtension(string *filename,string *e)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  string *in_RSI;
  string filenameExtension;
  string ext;
  string *in_stack_ffffffffffffff28;
  undefined1 *puVar4;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 local_b0 [8];
  undefined1 local_a8 [8];
  undefined1 local_a0 [8];
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  string local_68 [48];
  string local_38 [55];
  bool local_1;
  
  std::__cxx11::string::string(local_38,in_RSI);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if (*pcVar2 == '.') {
      std::__cxx11::string::erase((ulong)local_38,0);
    }
  }
  filesystem::path::path
            ((path *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28);
  filesystem::path::extension_abi_cxx11_
            ((path *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  filesystem::path::~path((path *)0x4b45e7);
  uVar1 = std::__cxx11::string::size();
  uVar3 = std::__cxx11::string::size();
  if (uVar3 < uVar1) {
    local_1 = false;
  }
  else {
    std::__cxx11::string::rbegin();
    std::__cxx11::string::rend();
    puVar4 = local_b0;
    std::__cxx11::string::rbegin();
    local_1 = std::
              equal<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,pbrt::HasExtension(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                        (local_a0,local_a8,puVar4);
  }
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_38);
  return (bool)(local_1 & 1);
}

Assistant:

bool HasExtension(const std::string &filename, const std::string &e) {
    std::string ext = e;
    if (!ext.empty() && ext[0] == '.')
        ext.erase(0, 1);

    std::string filenameExtension = filesystem::path(filename).extension();
    if (ext.size() > filenameExtension.size())
        return false;
    return std::equal(ext.rbegin(), ext.rend(), filenameExtension.rbegin(),
                      [](char a, char b) { return std::tolower(a) == std::tolower(b); });
}